

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSeparateShaderTests.cpp
# Opt level: O2

bool deqp::gles31::Functional::anon_unknown_0::paramsValid(TestParams *params)

{
  bool bVar1;
  VaryingInterpolation VVar2;
  VaryingInterpolation VVar3;
  
  if (params->initSingle == true) {
    if (params->useSameName != false) {
      return false;
    }
    bVar1 = params->switchFrg;
    if ((params->switchVtx == false) && ((bVar1 & 1U) == 0)) {
      if (bVar1 != false) {
        return false;
      }
      if (params->useCreateHelper != false) {
        return false;
      }
    }
    else if (params->switchVtx != bVar1) {
      return false;
    }
  }
  if ((params->useProgramUniform == true) && (params->useUniform != true)) {
    return false;
  }
  VVar3 = (params->varyings).vtxInterp;
  if ((params->varyings).count == 0) {
    if (VVar3 != VARYINGINTERPOLATION_LAST) {
      return false;
    }
    if ((params->varyings).frgInterp != VARYINGINTERPOLATION_LAST) {
      return false;
    }
    VVar3 = VARYINGINTERPOLATION_LAST;
  }
  else if (VVar3 == VARYINGINTERPOLATION_RANDOM) {
    return true;
  }
  VVar2 = (params->varyings).frgInterp;
  if ((VVar2 != VARYINGINTERPOLATION_RANDOM) &&
     ((VVar3 == VARYINGINTERPOLATION_FLAT) == (VVar2 != VARYINGINTERPOLATION_FLAT))) {
    return false;
  }
  return true;
}

Assistant:

bool paramsValid (const TestParams& params)
{
	using namespace glu;

	// Final pipeline has a single program?
	if (params.initSingle)
	{
		// Cannot have conflicting names for uniforms or constants
		if (params.useSameName)
			return false;

		// CreateShaderProgram would never get called
		if (!params.switchVtx && !params.switchFrg && params.useCreateHelper)
			return false;

		// Must switch either all or nothing
		if (params.switchVtx != params.switchFrg)
			return false;
	}

	// ProgramUniform would never get called
	if (params.useProgramUniform && !params.useUniform)
		return false;

	// Interpolation is meaningless if we don't use an in/out variable.
	if (params.varyings.count == 0 &&
		!(params.varyings.vtxInterp == VARYINGINTERPOLATION_LAST &&
		  params.varyings.frgInterp == VARYINGINTERPOLATION_LAST))
		return false;

	// Mismatch by flat / smooth is not allowed. See Khronos bug #12630
	// \note: iterpolations might be RANDOM, causing generated varyings potentially match / mismatch anyway.
	//        This is checked later on. Here, we just make sure that we don't force the generator to generate
	//        only invalid varying configurations, i.e. there exists a valid varying configuration for this
	//        test param config.
	if ((params.varyings.vtxInterp != VARYINGINTERPOLATION_RANDOM) &&
		(params.varyings.frgInterp != VARYINGINTERPOLATION_RANDOM) &&
		(params.varyings.vtxInterp == VARYINGINTERPOLATION_FLAT) != (params.varyings.frgInterp == VARYINGINTERPOLATION_FLAT))
		return false;

	return true;
}